

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

double __thiscall icu_63::CalendarAstronomer::getSunLongitude(CalendarAstronomer *this)

{
  UBool UVar1;
  CalendarAstronomer *this_00;
  double jDay;
  
  UVar1 = uprv_isNaN_63(this->sunLongitude);
  if (UVar1 != '\0') {
    this_00 = this;
    jDay = getJulianDay(this);
    getSunLongitude(this_00,jDay,&this->sunLongitude,&this->meanAnomalySun);
  }
  return this->sunLongitude;
}

Assistant:

double CalendarAstronomer::getSunLongitude()
{
    // See page 86 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.

    if (isINVALID(sunLongitude)) {
        getSunLongitude(getJulianDay(), sunLongitude, meanAnomalySun);
    }
    return sunLongitude;
}